

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_cmdline.cpp
# Opt level: O3

bool __thiscall Omega_h::CmdLine::parse(CmdLine *this,int *p_argc,char **argv,bool should_print)

{
  pointer puVar1;
  pointer puVar2;
  __uniq_ptr_data<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>,_true,_true> _Var3
  ;
  CmdLineFlag *pCVar4;
  bool bVar5;
  int iVar6;
  ostream *poVar7;
  int i_00;
  size_t i;
  pointer puVar8;
  ulong uVar9;
  long *local_50 [2];
  long local_40 [2];
  
  if (1 < *p_argc) {
    i_00 = 1;
    do {
      puVar8 = (this->flags_).
               super__Vector_base<std::unique_ptr<Omega_h::CmdLineFlag,_std::default_delete<Omega_h::CmdLineFlag>_>,_std::allocator<std::unique_ptr<Omega_h::CmdLineFlag,_std::default_delete<Omega_h::CmdLineFlag>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar1 = (this->flags_).
               super__Vector_base<std::unique_ptr<Omega_h::CmdLineFlag,_std::default_delete<Omega_h::CmdLineFlag>_>,_std::allocator<std::unique_ptr<Omega_h::CmdLineFlag,_std::default_delete<Omega_h::CmdLineFlag>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (puVar8 == puVar1) {
LAB_0024b0ad:
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"--help","");
        iVar6 = std::__cxx11::string::compare((char *)local_50);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
        if (iVar6 == 0) {
          this->parsed_help_ = true;
        }
        else {
          puVar2 = (this->args_).
                   super__Vector_base<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>,_std::allocator<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (this->nargs_parsed_ <
              (ulong)((long)(this->args_).
                            super__Vector_base<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>,_std::allocator<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 3)) {
            bVar5 = CmdLineItem::parse((CmdLineItem *)
                                       puVar2[this->nargs_parsed_]._M_t.
                                       super___uniq_ptr_impl<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>
                                       ,p_argc,argv,i_00,should_print);
            if (bVar5) {
              this->nargs_parsed_ = this->nargs_parsed_ + 1;
            }
            goto LAB_0024b13e;
          }
        }
        i_00 = i_00 + 1;
      }
      else {
        bVar5 = false;
        do {
          while (iVar6 = std::__cxx11::string::compare
                                   ((char *)&(((puVar8->_M_t).
                                               super___uniq_ptr_impl<Omega_h::CmdLineFlag,_std::default_delete<Omega_h::CmdLineFlag>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_Omega_h::CmdLineFlag_*,_std::default_delete<Omega_h::CmdLineFlag>_>
                                               .super__Head_base<0UL,_Omega_h::CmdLineFlag_*,_false>
                                              ._M_head_impl)->super_CmdLineItem).name_), iVar6 != 0)
          {
            puVar8 = puVar8 + 1;
            if (puVar8 == puVar1) {
              if (!bVar5) goto LAB_0024b0ad;
              goto LAB_0024b13e;
            }
          }
          bVar5 = CmdLineItem::parse(&((puVar8->_M_t).
                                       super___uniq_ptr_impl<Omega_h::CmdLineFlag,_std::default_delete<Omega_h::CmdLineFlag>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_Omega_h::CmdLineFlag_*,_std::default_delete<Omega_h::CmdLineFlag>_>
                                       .super__Head_base<0UL,_Omega_h::CmdLineFlag_*,_false>.
                                      _M_head_impl)->super_CmdLineItem,p_argc,argv,i_00,should_print
                                    );
          if (!bVar5 && should_print) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"failed to parse flag ",0x15);
            pCVar4 = (puVar8->_M_t).
                     super___uniq_ptr_impl<Omega_h::CmdLineFlag,_std::default_delete<Omega_h::CmdLineFlag>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Omega_h::CmdLineFlag_*,_std::default_delete<Omega_h::CmdLineFlag>_>
                     .super__Head_base<0UL,_Omega_h::CmdLineFlag_*,_false>._M_head_impl;
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,
                                (pCVar4->super_CmdLineItem).name_._M_dataplus._M_p,
                                *(size_type *)((long)&(pCVar4->super_CmdLineItem).name_ + 8));
            local_50[0] = (long *)CONCAT71(local_50[0]._1_7_,10);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)local_50,1);
            goto LAB_0024b217;
          }
          if (!bVar5) goto LAB_0024b217;
          puVar8 = puVar8 + 1;
          bVar5 = true;
        } while (puVar8 != puVar1);
      }
LAB_0024b13e:
    } while (i_00 < *p_argc);
  }
  uVar9 = this->nargs_parsed_;
  bVar5 = (ulong)((long)(this->args_).
                        super__Vector_base<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>,_std::allocator<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->args_).
                        super__Vector_base<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>,_std::allocator<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar9;
  if (should_print && !bVar5) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"missing required argument <",0x1b);
      _Var3.super___uniq_ptr_impl<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>.
      _M_t.
      super__Tuple_impl<0UL,_Omega_h::CmdLineItem_*,_std::default_delete<Omega_h::CmdLineItem>_>.
      super__Head_base<0UL,_Omega_h::CmdLineItem_*,_false>._M_head_impl =
           (this->args_).
           super__Vector_base<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>,_std::allocator<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar9]._M_t.
           super___uniq_ptr_impl<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>;
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,
                          *(char **)((long)_Var3.
                                           super___uniq_ptr_impl<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_Omega_h::CmdLineItem_*,_std::default_delete<Omega_h::CmdLineItem>_>
                                           .super__Head_base<0UL,_Omega_h::CmdLineItem_*,_false>.
                                           _M_head_impl + 8),
                          *(long *)((long)_Var3.
                                          super___uniq_ptr_impl<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_Omega_h::CmdLineItem_*,_std::default_delete<Omega_h::CmdLineItem>_>
                                          .super__Head_base<0UL,_Omega_h::CmdLineItem_*,_false>.
                                          _M_head_impl + 0x10));
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,">\n",2);
      uVar9 = uVar9 + 1;
    } while (uVar9 < (ulong)((long)(this->args_).
                                   super__Vector_base<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>,_std::allocator<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->args_).
                                   super__Vector_base<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>,_std::allocator<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
LAB_0024b217:
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool CmdLine::parse(int* p_argc, char** argv, bool should_print) {
  for (int i = 1; i < *p_argc;) {
    bool parsed_by_flag = false;
    for (auto const& flag : flags_) {
      if (flag->name() == argv[i]) {
        if (!flag->parse(p_argc, argv, i, should_print)) {
          if (should_print) {
            std::cout << "failed to parse flag " << flag->name() << '\n';
          }
          return false;
        }
        parsed_by_flag = true;
      }
    }
    if (parsed_by_flag) {
      continue;
    } else if (std::string("--help") == argv[i]) {
      parsed_help_ = true;
      ++i;
    } else if (args_.size() > nargs_parsed_) {
      if (args_[nargs_parsed_]->parse(p_argc, argv, i, should_print)) {
        ++nargs_parsed_;
      }
    } else {
      ++i;
    }
  }
  if (nargs_parsed_ < args_.size()) {
    if (should_print) {
      for (std::size_t i = nargs_parsed_; i < args_.size(); ++i) {
        std::cout << "missing required argument <" << args_[i]->name() << ">\n";
      }
    }
    return false;
  }
  return true;
}